

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O3

_Bool do_brk3(DisasContext_conflict1 *s,arg_rprr_s *a,undefined1 *fn,gen_helper_gvec_flags_4 *fn_s)

{
  int iVar1;
  TCGContext_conflict1 *s_00;
  _Bool _Var2;
  undefined1 extraout_AL;
  TCGTemp *pTVar3;
  TCGv_i64 ret;
  TCGv_i32 t;
  uintptr_t o_2;
  TCGv_i64 ret_00;
  uintptr_t o;
  uintptr_t o_1;
  TCGv_i64 ret_01;
  uintptr_t o_3;
  TCGv_i64 ret_02;
  
  s_00 = s->uc->tcg_ctx;
  _Var2 = sve_access_check_aarch64(s);
  if (_Var2) {
    iVar1 = s->sve_len;
    pTVar3 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    ret_01 = (TCGv_i64)((long)pTVar3 - (long)s_00);
    pTVar3 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    ret_00 = (TCGv_i64)((long)pTVar3 - (long)s_00);
    pTVar3 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    ret = (TCGv_i64)((long)pTVar3 - (long)s_00);
    pTVar3 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    ret_02 = (TCGv_i64)((long)pTVar3 - (long)s_00);
    t = tcg_const_i32_aarch64(s_00,(iVar1 >> 3) + -2);
    tcg_gen_addi_i64_aarch64(s_00,ret_01,(TCGv_i64)s_00->cpu_env,(long)(a->rd * 0x20 + 0x2c10));
    tcg_gen_addi_i64_aarch64(s_00,ret_00,(TCGv_i64)s_00->cpu_env,(long)(a->rn * 0x20 + 0x2c10));
    tcg_gen_addi_i64_aarch64(s_00,ret,(TCGv_i64)s_00->cpu_env,(long)(a->rm * 0x20 + 0x2c10));
    tcg_gen_addi_i64_aarch64(s_00,ret_02,(TCGv_i64)s_00->cpu_env,(long)(a->pg * 0x20 + 0x2c10));
    if (a->s == 0) {
      (*(code *)fn)(s_00,ret_01,ret_00,ret,ret_02,t);
    }
    else {
      (*fn_s)(s_00,t,(TCGv_ptr)ret_01,(TCGv_ptr)ret_00,(TCGv_ptr)ret,(TCGv_ptr)ret_02,t);
      do_pred_flags(s_00,t);
    }
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(ret_01 + (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(ret_00 + (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(ret + (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(ret_02 + (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(t + (long)s_00));
    return (_Bool)extraout_AL;
  }
  return _Var2;
}

Assistant:

static bool do_brk3(DisasContext *s, arg_rprr_s *a,
                    gen_helper_gvec_4 *fn, gen_helper_gvec_flags_4 *fn_s)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (!sve_access_check(s)) {
        return true;
    }

    unsigned vsz = pred_full_reg_size(s);

    /* Predicate sizes may be smaller and cannot use simd_desc.  */
    TCGv_ptr d = tcg_temp_new_ptr(tcg_ctx);
    TCGv_ptr n = tcg_temp_new_ptr(tcg_ctx);
    TCGv_ptr m = tcg_temp_new_ptr(tcg_ctx);
    TCGv_ptr g = tcg_temp_new_ptr(tcg_ctx);
    TCGv_i32 t = tcg_const_i32(tcg_ctx, vsz - 2);

    tcg_gen_addi_ptr(tcg_ctx, d, tcg_ctx->cpu_env, pred_full_reg_offset(s, a->rd));
    tcg_gen_addi_ptr(tcg_ctx, n, tcg_ctx->cpu_env, pred_full_reg_offset(s, a->rn));
    tcg_gen_addi_ptr(tcg_ctx, m, tcg_ctx->cpu_env, pred_full_reg_offset(s, a->rm));
    tcg_gen_addi_ptr(tcg_ctx, g, tcg_ctx->cpu_env, pred_full_reg_offset(s, a->pg));

    if (a->s) {
        fn_s(tcg_ctx, t, d, n, m, g, t);
        do_pred_flags(tcg_ctx, t);
    } else {
        fn(tcg_ctx, d, n, m, g, t);
    }
    tcg_temp_free_ptr(tcg_ctx, d);
    tcg_temp_free_ptr(tcg_ctx, n);
    tcg_temp_free_ptr(tcg_ctx, m);
    tcg_temp_free_ptr(tcg_ctx, g);
    tcg_temp_free_i32(tcg_ctx, t);
    return true;
}